

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::SetScriptModeFile(cmMakefile *this,string *scriptfile)

{
  char *value;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *scriptfile_local;
  cmMakefile *this_local;
  
  local_18 = scriptfile;
  scriptfile_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_SCRIPT_MODE_FILE",&local_39);
  value = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmMakefile::SetScriptModeFile(std::string const& scriptfile)
{
  this->AddDefinition("CMAKE_SCRIPT_MODE_FILE", scriptfile.c_str());
}